

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<testing::TestPartResult>::
construct<testing::TestPartResult,testing::TestPartResult>
          (new_allocator<testing::TestPartResult> *this,TestPartResult *__p,TestPartResult *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  __p->type_ = __args->type_;
  paVar1 = &(__p->file_name_).field_2;
  (__p->file_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->file_name_)._M_dataplus._M_p;
  paVar2 = &(__args->file_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->file_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->file_name_).field_2 + 8) = uVar4;
  }
  else {
    (__p->file_name_)._M_dataplus._M_p = pcVar3;
    (__p->file_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->file_name_)._M_string_length = (__args->file_name_)._M_string_length;
  (__args->file_name_)._M_dataplus._M_p = (pointer)paVar2;
  (__args->file_name_)._M_string_length = 0;
  (__args->file_name_).field_2._M_local_buf[0] = '\0';
  __p->line_number_ = __args->line_number_;
  paVar1 = &(__p->summary_).field_2;
  (__p->summary_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->summary_)._M_dataplus._M_p;
  paVar2 = &(__args->summary_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->summary_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->summary_).field_2 + 8) = uVar4;
  }
  else {
    (__p->summary_)._M_dataplus._M_p = pcVar3;
    (__p->summary_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->summary_)._M_string_length = (__args->summary_)._M_string_length;
  (__args->summary_)._M_dataplus._M_p = (pointer)paVar2;
  (__args->summary_)._M_string_length = 0;
  (__args->summary_).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->message_).field_2;
  (__p->message_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->message_)._M_dataplus._M_p;
  paVar2 = &(__args->message_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->message_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->message_).field_2 + 8) = uVar4;
  }
  else {
    (__p->message_)._M_dataplus._M_p = pcVar3;
    (__p->message_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->message_)._M_string_length = (__args->message_)._M_string_length;
  (__args->message_)._M_dataplus._M_p = (pointer)paVar2;
  (__args->message_)._M_string_length = 0;
  (__args->message_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

class GTEST_API_ TestPartResult {
 public:
  // The possible outcomes of a test part (i.e. an assertion or an
  // explicit SUCCEED(), FAIL(), or ADD_FAILURE()).
  enum Type {
    kSuccess,          // Succeeded.
    kNonFatalFailure,  // Failed but the test can continue.
    kFatalFailure      // Failed and the test should be terminated.
  };

  // C'tor.  TestPartResult does NOT have a default constructor.
  // Always use this constructor (with parameters) to create a
  // TestPartResult object.
  TestPartResult(Type a_type,
                 const char* a_file_name,
                 int a_line_number,
                 const char* a_message)
      : type_(a_type),
        file_name_(a_file_name == NULL ? "" : a_file_name),
        line_number_(a_line_number),
        summary_(ExtractSummary(a_message)),
        message_(a_message) {
  }

  // Gets the outcome of the test part.
  Type type() const { return type_; }

  // Gets the name of the source file where the test part took place, or
  // NULL if it's unknown.
  const char* file_name() const {
    return file_name_.empty() ? NULL : file_name_.c_str();
  }

  // Gets the line in the source file where the test part took place,
  // or -1 if it's unknown.
  int line_number() const { return line_number_; }

  // Gets the summary of the failure message.
  const char* summary() const { return summary_.c_str(); }

  // Gets the message associated with the test part.
  const char* message() const { return message_.c_str(); }

  // Returns true iff the test part passed.
  bool passed() const { return type_ == kSuccess; }

  // Returns true iff the test part failed.
  bool failed() const { return type_ != kSuccess; }

  // Returns true iff the test part non-fatally failed.
  bool nonfatally_failed() const { return type_ == kNonFatalFailure; }

  // Returns true iff the test part fatally failed.
  bool fatally_failed() const { return type_ == kFatalFailure; }

 private:
  Type type_;

  // Gets the summary of the failure message by omitting the stack
  // trace in it.
  static std::string ExtractSummary(const char* message);

  // The name of the source file where the test part took place, or
  // "" if the source file is unknown.
  std::string file_name_;
  // The line in the source file where the test part took place, or -1
  // if the line number is unknown.
  int line_number_;
  std::string summary_;  // The test failure summary.
  std::string message_;  // The test failure message.
}